

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

long Curl_pp_state_timeout(pingpong *pp)

{
  connectdata *pcVar1;
  SessionHandle *pSVar2;
  long lVar3;
  timeval tVar4;
  long local_78;
  long local_60;
  long response_time;
  long timeout2_ms;
  long timeout_ms;
  SessionHandle *data;
  connectdata *conn;
  pingpong *pp_local;
  
  pcVar1 = pp->conn;
  pSVar2 = pcVar1->data;
  if ((pSVar2->set).server_response_timeout == 0) {
    local_60 = pp->response_time;
  }
  else {
    local_60 = (pSVar2->set).server_response_timeout;
  }
  tVar4 = curlx_tvnow();
  lVar3 = curlx_tvdiff(tVar4,pp->response);
  timeout2_ms = local_60 - lVar3;
  if ((pSVar2->set).timeout != 0) {
    local_78 = (pSVar2->set).timeout;
    tVar4 = curlx_tvnow();
    lVar3 = curlx_tvdiff(tVar4,pcVar1->now);
    local_78 = local_78 - lVar3;
    if (timeout2_ms < local_78) {
      local_78 = timeout2_ms;
    }
    timeout2_ms = local_78;
  }
  return timeout2_ms;
}

Assistant:

long Curl_pp_state_timeout(struct pingpong *pp)
{
  struct connectdata *conn = pp->conn;
  struct SessionHandle *data=conn->data;
  long timeout_ms; /* in milliseconds */
  long timeout2_ms; /* in milliseconds */
  long response_time= (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    Curl_tvdiff(Curl_tvnow(), pp->response); /* spent time */

  if(data->set.timeout) {
    /* if timeout is requested, find out how much remaining time we have */
    timeout2_ms = data->set.timeout - /* timeout time */
      Curl_tvdiff(Curl_tvnow(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}